

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

int CVodeQuadSensSVtolerances(void *cvode_mem,sunrealtype reltolQS,N_Vector *abstolQS)

{
  long lVar1;
  int iVar2;
  void *__ptr;
  undefined8 uVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  int error_code;
  char *msgfmt;
  ulong uVar7;
  long lVar8;
  double dVar9;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar6 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    iVar2 = 0x9d0;
  }
  else if (*(int *)((long)cvode_mem + 0x860) == 0) {
    msgfmt = "Forward sensitivity analysis not activated.";
    iVar6 = -0x28;
    error_code = -0x28;
    iVar2 = 0x9d9;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x86c) == 0) {
      cvProcessError((CVodeMem)cvode_mem,-0x32,0x9e2,"CVodeQuadSensSVtolerances",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                     ,"Forward sensitivity analysis for quadrature variables not activated.");
      return -0x1e;
    }
    if (0.0 <= reltolQS) {
      if (abstolQS == (N_Vector *)0x0) {
        msgfmt = "abstolQS = NULL illegal.";
        iVar6 = -0x16;
        error_code = -0x16;
        iVar2 = 0x9f2;
      }
      else {
        if (*(long *)(*(long *)(*(long *)((long)cvode_mem + 0x1d0) + 8) + 0xb8) != 0) {
          uVar7 = (ulong)*(int *)((long)cvode_mem + 0x90);
          __ptr = malloc(uVar7 * 8);
          if (0 < (long)uVar7) {
            lVar8 = 0;
            do {
              dVar9 = (double)N_VMin(abstolQS[lVar8]);
              *(double *)((long)__ptr + lVar8 * 8) = dVar9;
              if (dVar9 < 0.0) {
                cvProcessError((CVodeMem)cvode_mem,-0x16,0xa03,"CVodeQuadSensSVtolerances",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                               ,"abstolQS has negative component(s) (illegal).");
                free(__ptr);
                return -0x16;
              }
              lVar8 = lVar8 + 1;
              uVar7 = (ulong)*(int *)((long)cvode_mem + 0x90);
            } while (lVar8 < (long)uVar7);
          }
          *(undefined4 *)((long)cvode_mem + 0x128) = 2;
          *(sunrealtype *)((long)cvode_mem + 0x130) = reltolQS;
          if (*(int *)((long)cvode_mem + 0x864) == 0) {
            uVar3 = N_VCloneVectorArray(uVar7 & 0xffffffff,*(undefined8 *)((long)cvode_mem + 0x280))
            ;
            *(undefined8 *)((long)cvode_mem + 0x140) = uVar3;
            lVar8 = (long)*(int *)((long)cvode_mem + 0x90);
            pvVar4 = malloc(lVar8 * 4);
            *(void **)((long)cvode_mem + 0x148) = pvVar4;
            *(long *)((long)cvode_mem + 0x718) =
                 *(long *)((long)cvode_mem + 0x718) + *(long *)((long)cvode_mem + 0x708) * lVar8;
            *(long *)((long)cvode_mem + 0x720) =
                 *(long *)((long)cvode_mem + 0x720) + lVar8 * *(long *)((long)cvode_mem + 0x710);
            *(undefined4 *)((long)cvode_mem + 0x864) = 1;
          }
          uVar7 = (ulong)*(uint *)((long)cvode_mem + 0x90);
          if (0 < (int)*(uint *)((long)cvode_mem + 0x90)) {
            lVar8 = *(long *)((long)cvode_mem + 0xa50);
            lVar1 = *(long *)((long)cvode_mem + 0x148);
            lVar5 = 0;
            do {
              *(undefined8 *)(lVar8 + lVar5 * 8) = 0x3ff0000000000000;
              *(uint *)(lVar1 + lVar5 * 4) =
                   -(uint)(*(double *)((long)__ptr + lVar5 * 8) == 0.0) & 1;
              lVar5 = lVar5 + 1;
              uVar7 = (ulong)*(int *)((long)cvode_mem + 0x90);
            } while (lVar5 < (long)uVar7);
          }
          free(__ptr);
          iVar2 = N_VScaleVectorArray(uVar7 & 0xffffffff,*(undefined8 *)((long)cvode_mem + 0xa50),
                                      abstolQS,*(undefined8 *)((long)cvode_mem + 0x140));
          if (iVar2 != 0) {
            return -0x1c;
          }
          return 0;
        }
        msgfmt = "Missing N_VMin routine from N_Vector";
        iVar6 = -0x16;
        error_code = -0x16;
        iVar2 = 0x9f9;
      }
    }
    else {
      msgfmt = "reltolQS < 0 illegal.";
      iVar6 = -0x16;
      error_code = -0x16;
      iVar2 = 0x9eb;
    }
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar2,"CVodeQuadSensSVtolerances",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return iVar6;
}

Assistant:

int CVodeQuadSensSVtolerances(void* cvode_mem, sunrealtype reltolQS,
                              N_Vector* abstolQS)
{
  CVodeMem cv_mem;
  int is, retval;
  sunrealtype* atolmin;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* check if sensitivity was initialized */

  if (cv_mem->cv_SensMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  /* Ckeck if quadrature sensitivity was initialized? */

  if (cv_mem->cv_QuadSensMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_QUADSENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUADSENSI);
    return (CV_NO_QUAD);
  }

  /* Test user-supplied tolerances */

  if (reltolQS < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_RELTOLQS);
    return (CV_ILL_INPUT);
  }

  if (abstolQS == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_ABSTOLQS);
    return (CV_ILL_INPUT);
  }

  if (cv_mem->cv_tempv->ops->nvmin == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Missing N_VMin routine from N_Vector");
    return (CV_ILL_INPUT);
  }
  atolmin = (sunrealtype*)malloc(cv_mem->cv_Ns * sizeof(sunrealtype));
  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    atolmin[is] = N_VMin(abstolQS[is]);
    if (atolmin[is] < ZERO)
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     MSGCV_BAD_ABSTOLQS);
      free(atolmin);
      return (CV_ILL_INPUT);
    }
  }

  /* Copy tolerances into memory */

  cv_mem->cv_itolQS = CV_SV;

  cv_mem->cv_reltolQS = reltolQS;

  if (!(cv_mem->cv_VabstolQSMallocDone))
  {
    cv_mem->cv_VabstolQS = N_VCloneVectorArray(cv_mem->cv_Ns, cv_mem->cv_tempvQ);
    cv_mem->cv_atolQSmin0 =
      (sunbooleantype*)malloc(cv_mem->cv_Ns * sizeof(sunbooleantype));
    cv_mem->cv_lrw += cv_mem->cv_Ns * cv_mem->cv_lrw1Q;
    cv_mem->cv_liw += cv_mem->cv_Ns * cv_mem->cv_liw1Q;
    cv_mem->cv_VabstolQSMallocDone = SUNTRUE;
  }

  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    cv_mem->cv_cvals[is]      = ONE;
    cv_mem->cv_atolQSmin0[is] = (atolmin[is] == ZERO);
  }
  free(atolmin);

  retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals, abstolQS,
                               cv_mem->cv_VabstolQS);
  if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

  return (CV_SUCCESS);
}